

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O1

object_iterator __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::try_emplace<int>
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this,
          object_iterator hint,string_view_type *name,int *args)

{
  object_iterator oVar1;
  byte bVar2;
  sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
  *this_00;
  type tVar3;
  not_an_object *this_01;
  undefined8 extraout_RDX;
  object_iterator oVar4;
  
  bVar2 = *(byte *)&this->field_0 & 0xf;
  if (bVar2 != 0xd) {
    if (bVar2 == 9) {
      oVar4._9_7_ = 0;
      oVar4.it_._M_current =
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
            *)(long)hint._0_9_;
      oVar4.has_value_ = (bool)(char)(hint._0_9_ >> 0x40);
      oVar4 = try_emplace<int>((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                               (this->field_0).long_str_.ptr_,oVar4,name,args);
      return oVar4;
    }
    if (bVar2 != 4) {
      this_01 = (not_an_object *)__cxa_allocate_exception(0x58);
      not_an_object::not_an_object<char>(this_01,name->_M_str,name->_M_len);
      __cxa_throw(this_01,&not_an_object::typeinfo,not_an_object::~not_an_object);
    }
    create_object_implicitly(this);
  }
  this_00 = (sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
             *)basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::object_storage::
               value_abi_cxx11_((object_storage *)this);
  tVar3 = sorted_json_object<std::__cxx11::string,jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector>
          ::try_emplace<std::allocator<char>,int>
                    (this_00,(key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                              *)hint.it_._M_current,name,args);
  oVar1._9_7_ = (int7)((ulong)extraout_RDX >> 8);
  oVar1.has_value_ = true;
  oVar1.it_._M_current = tVar3._M_current;
  return oVar1;
}

Assistant:

object_iterator try_emplace(object_iterator hint, const string_view_type& name, Args&&... args)
        {
            switch (storage_kind())
            {
                case json_storage_kind::empty_object:
                    create_object_implicitly();
                    return object_iterator(cast<object_storage>().value().try_emplace(hint, name, std::forward<Args>(args)...));
                case json_storage_kind::object:
                    return object_iterator(cast<object_storage>().value().try_emplace(hint, name, std::forward<Args>(args)...));
                case json_storage_kind::json_reference:
                    return object_iterator(cast<json_reference_storage>().value().try_emplace(hint, name, std::forward<Args>(args)...));
                default:
                    JSONCONS_THROW(not_an_object(name.data(),name.length()));
            }
        }